

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier_ooura.cc
# Opt level: O0

void __thiscall
webrtc::RealFourierOoura::Inverse(RealFourierOoura *this,complex<float> *src,float *dest)

{
  size_t n;
  complex<float> *a;
  pointer ip;
  pointer w;
  float __r;
  float __i;
  float local_48;
  complex<float> cStack_38;
  float scale;
  size_t local_30;
  size_t dest_complex_length;
  complex<float> *dest_complex;
  float *dest_local;
  complex<float> *src_local;
  RealFourierOoura *this_local;
  
  local_30 = this->complex_length_ - 1;
  dest_complex_length = (size_t)dest;
  dest_complex = (complex<float> *)dest;
  dest_local = (float *)src;
  src_local = (complex<float> *)this;
  std::copy<std::complex<float>const*,std::complex<float>*>
            (src,src + local_30,(complex<float> *)dest);
  anon_unknown_2::Conjugate((complex<float> *)dest_complex_length,local_30);
  __r = std::complex<float>::real_abi_cxx11_((complex<float> *)dest_complex_length);
  __i = std::complex<float>::real_abi_cxx11_
                  ((complex<float> *)(dest_local + this->complex_length_ * 2 + -2));
  std::complex<float>::complex(&stack0xffffffffffffffc8,__r,__i);
  a = dest_complex;
  *(_ComplexT *)dest_complex_length = cStack_38._M_value;
  n = this->length_;
  ip = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get(&this->work_ip_)
  ;
  w = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->work_w_);
  WebRtc_rdft(n,-1,(float *)a,ip,w);
  local_48 = (float)this->length_;
  std::
  for_each<float*,webrtc::RealFourierOoura::Inverse(std::complex<float>const*,float*)const::__0>
            ((float *)dest_complex,(float *)((long)&dest_complex->_M_value + this->length_ * 4),
             (anon_class_4_1_a89cf86a)(2.0 / local_48));
  return;
}

Assistant:

void RealFourierOoura::Inverse(const complex<float>* src, float* dest) const {
  {
    auto dest_complex = reinterpret_cast<complex<float>*>(dest);
    // The real output array is shorter than the input complex array by one
    // complex element.
    const size_t dest_complex_length = complex_length_ - 1;
    std::copy(src, src + dest_complex_length, dest_complex);
    // Restore Ooura's conjugate definition.
    Conjugate(dest_complex, dest_complex_length);
    // Restore real[n/2] to imag[0].
    dest_complex[0] = complex<float>(dest_complex[0].real(),
                                     src[complex_length_ - 1].real());
  }

  WebRtc_rdft(length_, -1, dest, work_ip_.get(), work_w_.get());

  // Ooura returns a scaled version.
  const float scale = 2.0f / length_;
  std::for_each(dest, dest + length_, [scale](float& v) { v *= scale; });
}